

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamWriter::QXmlStreamWriter(QXmlStreamWriter *this)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  
  this_00._M_head_impl = (QXmlStreamWriterPrivate *)operator_new(0xe0);
  QXmlStreamWriterPrivate::QXmlStreamWriterPrivate(this_00._M_head_impl,this);
  (this->d_ptr)._M_t.
  super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>.
  super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl = this_00._M_head_impl;
  return;
}

Assistant:

QXmlStreamWriter::QXmlStreamWriter()
    : d_ptr(new QXmlStreamWriterPrivate(this))
{
}